

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O3

Task * AI::create_Wander(void)

{
  vector<AI::Task,_std::allocator<AI::Task>_> *this;
  pointer pTVar1;
  Task *in_RDI;
  int in_R8D;
  undefined8 in_XMM1_Qa;
  float in_XMM2_Da;
  Vector3 debugSphereColour;
  Task selectDestination;
  Task moveToDestination;
  Task stopMoving;
  Task wait;
  string local_e38;
  string local_e18;
  Task local_df8;
  Task local_a80;
  Task local_708;
  Task local_390;
  
  local_e18._M_dataplus._M_p = (pointer)&local_e18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e18,"wander","");
  Task::Task(in_RDI,&local_e18,Compound);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e18._M_dataplus._M_p != &local_e18.field_2) {
    operator_delete(local_e18._M_dataplus._M_p,local_e18.field_2._M_allocated_capacity + 1);
  }
  Task::Task(&local_df8);
  local_df8.action = SelectDestination;
  local_a80.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  if (local_df8.parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_df8.parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_df8.parameters.values,
               (iterator)
               local_df8.parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl
               .super__Vector_impl_data._M_finish,(float *)&local_a80);
  }
  else {
    *local_df8.parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
     super__Vector_impl_data._M_finish = 0.0;
    local_df8.parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_df8.parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  debugSphereColour.z = in_XMM2_Da;
  debugSphereColour.x = (float)(int)in_XMM1_Qa;
  debugSphereColour.y = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  create_MoveToDestination(&local_a80,(AI *)0x1,70.0,debugSphereColour,1.0,true,true,in_R8D);
  local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e38,"stopMoving","");
  Task::Task(&local_708,&local_e38,Simple);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p,local_e38.field_2._M_allocated_capacity + 1);
  }
  local_708.action = StopMoving;
  create_Wait(&local_390,5.0);
  this = &in_RDI->subtasks;
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
      super__Vector_impl_data._M_start != pTVar1) {
    pTVar1[-1].isLastInCompound = false;
  }
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,&local_df8);
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar1[-1].isLastInCompound =
       (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start == pTVar1;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,&local_a80);
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar1[-1].isLastInCompound =
       (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start == pTVar1;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,&local_708);
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar1[-1].isLastInCompound =
       (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start == pTVar1;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(this,&local_390);
  (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].isLastInCompound = true;
  Task::~Task(&local_390);
  Task::~Task(&local_708);
  Task::~Task(&local_a80);
  Task::~Task(&local_df8);
  return in_RDI;
}

Assistant:

Task create_Wander()
	{
		Task wander {"wander", TaskType::Compound};
		Task selectDestination;
		selectDestination.action = Action::SelectDestination;
		selectDestination.parameters.values.push_back(static_cast<float>(DestinationType::RandomLocation));
		
		auto moveToDestination = create_MoveToDestination(70.f, {0.0f, 0.8f, 0.1f});		

		Task stopMoving {"stopMoving"};
		stopMoving.action = Action::StopMoving;

		auto wait = create_Wait(5.f);

		wander.addSubtask(selectDestination);
		wander.addSubtask(moveToDestination);
		wander.addSubtask(stopMoving);
		wander.addSubtask(wait);

		return wander;
	}